

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emit.h
# Opt level: O1

string * __thiscall
re2c::replaceParam<std::__cxx11::string>
          (string *__return_storage_ptr__,re2c *this,string *str,string *param,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value)

{
  re2c *prVar1;
  char *pcVar2;
  undefined8 uVar3;
  ulong uVar4;
  ostringstream strValue;
  long *local_1d0;
  long local_1c0 [2];
  string *local_1b0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  if (str->_M_string_length != 0) {
    local_1b0 = __return_storage_ptr__;
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,(param->_M_dataplus)._M_p,param->_M_string_length);
    uVar4 = std::__cxx11::string::find((char *)this,(ulong)(str->_M_dataplus)._M_p,0);
    while (uVar4 != 0xffffffffffffffff) {
      pcVar2 = (char *)str->_M_string_length;
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::replace((ulong)this,uVar4,pcVar2,(ulong)local_1d0);
      if (local_1d0 != local_1c0) {
        operator_delete(local_1d0,local_1c0[0] + 1);
      }
      uVar4 = std::__cxx11::string::find((char *)this,(ulong)(str->_M_dataplus)._M_p,0);
    }
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
    std::ios_base::~ios_base(local_138);
    __return_storage_ptr__ = local_1b0;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  prVar1 = this + 0x10;
  if (*(re2c **)this == prVar1) {
    uVar3 = *(undefined8 *)(this + 0x18);
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *(size_type *)prVar1;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar3;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*(re2c **)this;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *(size_type *)prVar1;
  }
  __return_storage_ptr__->_M_string_length = *(size_type *)(this + 8);
  *(re2c **)this = prVar1;
  *(undefined8 *)(this + 8) = 0;
  this[0x10] = (re2c)0x0;
  return __return_storage_ptr__;
}

Assistant:

std::string replaceParam (std::string str, const std::string & param, const _Ty & value)
{
	if (!param.empty ())
	{
		std::ostringstream strValue;
		strValue << value;
		std::string::size_type pos;
		while((pos = str.find(param)) != std::string::npos)
		{
			str.replace(pos, param.length(), strValue.str());
		}
	}
	return str;
}